

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O3

optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> * __thiscall
kratos::Simulator::eval_expr
          (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           *__return_storage_ptr__,Simulator *this,Var *var)

{
  _func_int **pp_Var1;
  unsigned_long uVar2;
  uint64_t uVar3;
  pointer ppVVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  pointer ppVVar10;
  runtime_error *prVar11;
  pointer ppVVar12;
  undefined1 auVar13 [8];
  Var *pVVar14;
  int iVar15;
  Var *pVVar16;
  optional<unsigned_long> oVar17;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  uint64_t local_b8;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *local_b0;
  undefined1 local_a8 [8];
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> predicate_val;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> right_val;
  allocator_type local_59;
  undefined1 auStack_58 [8];
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> vars;
  
  if (var->type_ != Expression) {
    get_complex_value_(__return_storage_ptr__,this,var);
    return __return_storage_ptr__;
  }
  pp_Var1 = var[1].super_IRNode._vptr_IRNode;
  if (pp_Var1 == (_func_int **)0x1d) {
    pVVar16 = (Var *)var[1].super_IRNode.fn_name_ln.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
    get_complex_value_((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                       auStack_58,this,pVVar16);
    if ((byte)vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == 0) {
LAB_001ce053:
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged = false;
    }
    else if (var->is_signed_ == true) {
      if (8 < (ulong)((long)vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                            _M_impl.super__Vector_impl_data._M_start - (long)auStack_58)) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar11,"Not implemented");
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pVVar14 = *(Var **)auStack_58;
      iVar15 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
      if ((ulong)pVVar14 >> ((char)iVar15 - 1U & 0x3f) != 0) {
        for (uVar7 = (*(pVVar16->super_IRNode)._vptr_IRNode[7])(pVVar16);
            uVar8 = (*(var->super_IRNode)._vptr_IRNode[7])(var), uVar7 < uVar8; uVar7 = uVar7 + 1) {
          pVVar14 = (Var *)((ulong)pVVar14 | (ulong)(uint)(1 << ((byte)uVar7 & 0x1f)));
        }
      }
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)local_a8;
      local_a8 = (undefined1  [8])pVVar14;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &predicate_val.
                  super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ._M_engaged,__l_02,(allocator_type *)&local_d0);
      *(undefined8 *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl = predicate_val.
                  super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ._24_8_;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           right_val.
           super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           right_val.
           super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged = true;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl = auStack_58;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      auStack_58 = (undefined1  [8])0x0;
      vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged = true;
    }
  }
  else {
    if (pp_Var1 == (_func_int **)0x1c) {
      local_b0 = __return_storage_ptr__;
      std::vector<kratos::Var*,std::allocator<kratos::Var*>>::
      vector<__gnu_cxx::__normal_iterator<kratos::Var*const*,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,void>
                ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)auStack_58,
                 (__normal_iterator<kratos::Var_*const_*,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                  )var[1].super_IRNode.fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (__normal_iterator<kratos::Var_*const_*,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                  )*(Var ***)&var[1].super_IRNode.verilog_ln,
                 (allocator_type *)
                 &predicate_val.
                  super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ._M_engaged);
      ppVVar4 = vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVVar10 = vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                 super__Vector_impl_data._M_start + -1;
      auVar13 = auStack_58;
      if ((ulong)auStack_58 < ppVVar10 &&
          auStack_58 !=
          (undefined1  [8])
          vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        do {
          ppVVar12 = (pointer)((long)auVar13 + 8);
          pVVar16 = *(Var **)auVar13;
          *(Var **)auVar13 = *ppVVar10;
          *ppVVar10 = pVVar16;
          ppVVar10 = ppVVar10 + -1;
          auVar13 = (undefined1  [8])ppVVar12;
        } while (ppVVar12 < ppVVar10);
      }
      iVar15 = 0;
      if (auStack_58 ==
          (undefined1  [8])
          vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pVVar16 = (Var *)0x0;
      }
      else {
        pVVar16 = (Var *)0x0;
        auVar13 = auStack_58;
        do {
          pVVar14 = *(Var **)auVar13;
          oVar17 = get_value_(this,pVVar14);
          if (((undefined1  [16])
               oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0) {
            (local_b0->
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_engaged = false;
            __return_storage_ptr__ = local_b0;
            goto LAB_001ce2c6;
          }
          iVar6 = (*(pVVar14->super_IRNode)._vptr_IRNode[7])(pVVar14);
          pVVar16 = (Var *)((ulong)pVVar16 |
                           oVar17.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_long>._M_payload <<
                           ((byte)iVar15 & 0x3f));
          iVar15 = iVar15 + iVar6;
          auVar13 = (undefined1  [8])((long)auVar13 + 8);
        } while (auVar13 != (undefined1  [8])ppVVar4);
      }
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_a8;
      local_a8 = (undefined1  [8])pVVar16;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &predicate_val.
                  super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ._M_engaged,__l_00,(allocator_type *)&local_d0);
      *(undefined8 *)
       &(local_b0->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl = predicate_val.
                  super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ._24_8_;
      (local_b0->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           right_val.
           super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (local_b0->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           right_val.
           super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (local_b0->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged = true;
      __return_storage_ptr__ = local_b0;
      goto LAB_001ce2c6;
    }
    get_complex_value_((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                       auStack_58,this,
                       (Var *)var[1].super_IRNode.fn_name_ln.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    if ((byte)vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == 0) goto LAB_001ce053;
    get_complex_value_((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                       &predicate_val.
                        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ._M_engaged,this,
                       (Var *)var[1].super_IRNode.fn_name_ln.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
    bVar5 = is_ternary_op((ExprOp)var[1].super_IRNode._vptr_IRNode);
    if (bVar5) {
      get_complex_value_((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                         local_a8,this,
                         (Var *)var[1].super_IRNode.fn_name_ln.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (predicate_val.
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_payload.field2[0x10] == '\0') {
        (__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_engaged = false;
        if (right_val.
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_payload.field2[0x10] == '\x01') {
          *(undefined8 *)
           &(__return_storage_ptr__->
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl = predicate_val.
                      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ._24_8_;
          (__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               right_val.
               super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          (__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               right_val.
               super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          predicate_val.
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_engaged = false;
          predicate_val.
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._25_7_ = 0;
          right_val.
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_engaged = true;
        }
      }
      else {
        uVar2 = *(unsigned_long *)local_a8;
        pVVar16 = *(Var **)auStack_58;
        uVar3 = *(uint64_t *)
                 predicate_val.
                 super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ._24_8_;
        uVar9 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
        local_b8 = eval_ternary_op(uVar2 != 0,(uint64_t)pVVar16,uVar3,uVar9);
        __l._M_len = 1;
        __l._M_array = &local_b8;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_d0,__l,&local_59);
        *(pointer *)
         &(__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl = local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_engaged = true;
      }
      if (((predicate_val.
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_payload.field2[0x10] & 1) != 0) &&
         (predicate_val.
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_payload.field2[0x10] = 0, local_a8 != (undefined1  [8])0x0)) {
        operator_delete((void *)local_a8,
                        (long)predicate_val.
                              super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              ._M_payload._M_value.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_a8);
      }
    }
    else {
      bVar5 = is_unary_op((ExprOp)var[1].super_IRNode._vptr_IRNode);
      if (bVar5) {
        pVVar16 = *(Var **)auStack_58;
        pp_Var1 = var[1].super_IRNode._vptr_IRNode;
        uVar9 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
        local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)eval_unary_op((uint64_t)pVVar16,(ExprOp)pp_Var1,uVar9);
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)&local_d0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8,__l_01,
                   (allocator_type *)&local_b8);
      }
      else {
        if (right_val.
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_payload.field2[0x10] == '\0') {
          (__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_engaged = false;
          goto LAB_001ce29c;
        }
        if (8 < (ulong)((long)vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58)) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar11,"Not implemented");
LAB_001ce35c:
          __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (8 < (ulong)((long)right_val.
                              super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              ._M_payload._M_value.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start -
                       predicate_val.
                       super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ._24_8_)) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar11,"Not implemented");
          goto LAB_001ce35c;
        }
        pVVar16 = *(Var **)auStack_58;
        uVar3 = *(uint64_t *)
                 predicate_val.
                 super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ._24_8_;
        pp_Var1 = var[1].super_IRNode._vptr_IRNode;
        uVar9 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
        local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)eval_bin_op((uint64_t)pVVar16,uVar3,(ExprOp)pp_Var1,uVar9,var->is_signed_);
        __l_03._M_len = 1;
        __l_03._M_array = (iterator)&local_d0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8,__l_03,
                   (allocator_type *)&local_b8);
      }
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl = local_a8;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           predicate_val.
           super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           predicate_val.
           super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged = true;
    }
LAB_001ce29c:
    if ((right_val.
         super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
         .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
         _M_payload.field2[0x10] == '\x01') &&
       (predicate_val.
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _24_8_ != 0)) {
      operator_delete((void *)predicate_val.
                              super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              ._24_8_,
                      (long)right_val.
                            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_payload._M_value.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      predicate_val.
                      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ._24_8_);
    }
  }
  if (((byte)vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage & 1) == 0) {
    return __return_storage_ptr__;
  }
  vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
LAB_001ce2c6:
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<uint64_t>> Simulator::eval_expr(const kratos::Var *var) const {
    if (var->type() == VarType::Expression) {
        const auto *expr = reinterpret_cast<const Expr *>(var);
        // there are couple special ones
        if (expr->op == ExprOp::Concat) {
            const auto *var_concat = reinterpret_cast<const VarConcat *>(expr);
            auto vars = std::vector<Var *>(var_concat->vars().begin(), var_concat->vars().end());
            std::reverse(vars.begin(), vars.end());
            uint32_t shift_amount = 0;
            uint64_t value = 0;
            for (auto *var_ : vars) {
                auto v = get_value_(var_);
                if (v) {
                    value |= (*v) << shift_amount;
                    shift_amount += var_->width();
                } else {
                    return std::nullopt;
                }
            }
            return std::vector<uint64_t>{value};
        } else if (expr->op == ExprOp::Extend) {
            // depends on whether it's a signed value or not
            const auto *extend = reinterpret_cast<const VarExtend *>(var);
            auto *base_var = extend->parent_var();
            auto value = get_complex_value_(base_var);
            if (!value) return std::nullopt;
            if (var->is_signed()) {
                // do signed extension
                if ((*value).size() > 1) {
                    throw std::runtime_error("Not implemented");
                }
                auto v = (*value)[0];
                if (v >> (var->width() - 1)) {
                    // do a signed extension
                    for (uint32_t i = base_var->width(); i < var->width(); i++) {
                        v |= 1u << i;
                    }
                }
                return std::vector<uint64_t>{v};
            } else {
                return value;
            }
        } else {
            auto left_val = get_complex_value_(expr->left);
            if (!left_val) return left_val;
            auto right_val = get_complex_value_(expr->right);
            if (is_ternary_op(expr->op)) {
                auto const *cond = reinterpret_cast<const ConditionalExpr *>(expr);
                auto predicate_val = get_complex_value_(cond->condition);
                if (!predicate_val) return right_val;
                bool c = (*predicate_val)[0];
                auto result = eval_ternary_op(c, (*left_val)[0], (*right_val)[0], expr->width());
                return std::vector<uint64_t>{result};
            } else if (!is_unary_op(expr->op)) {
                if (!right_val) return std::nullopt;
                if ((*left_val).size() > 1) throw std::runtime_error("Not implemented");
                if ((*right_val).size() > 1) throw std::runtime_error("Not implemented");
                auto left_value = (*left_val)[0];
                auto right_value = (*right_val)[0];
                auto result = eval_bin_op(left_value, right_value, expr->op, expr->width(),
                                          expr->is_signed());
                return std::vector<uint64_t>{result};
            } else {
                auto left_value = (*left_val)[0];
                auto result = eval_unary_op(left_value, expr->op, expr->width());
                return std::vector<uint64_t>{result};
            }
        }

    } else {
        return get_complex_value_(var);
    }
}